

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjuliancalendar.cpp
# Opt level: O1

bool __thiscall
QJulianCalendar::dateToJulianDay(QJulianCalendar *this,int year,int month,int day,qint64 *jd)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  
  iVar1 = (*(this->super_QRomanCalendar).super_QCalendarBackend._vptr_QCalendarBackend[6])();
  if (SUB41(iVar1,0) != false) {
    iVar5 = month + 9;
    if (2 < month) {
      iVar5 = month + -3;
    }
    iVar2 = (year - (year >> 0x1f)) - (uint)(month < 3);
    uVar3 = (long)iVar2 * 0x5b5;
    if (iVar2 < 0) {
      lVar4 = uVar3 + 4;
      if (-1 < (long)(uVar3 + 1)) {
        lVar4 = uVar3 + 1;
      }
      uVar3 = (lVar4 >> 2) - 1;
    }
    else {
      uVar3 = uVar3 >> 2;
    }
    *jd = uVar3 + (long)day + (ulong)(iVar5 * 0x99 + 2) / 5 + 0x1a431d;
  }
  return SUB41(iVar1,0);
}

Assistant:

bool QJulianCalendar::dateToJulianDay(int year, int month, int day, qint64 *jd) const
{
    Q_ASSERT(jd);
    if (!isDateValid(year, month, day))
        return false;

    const auto yearDays = yearMonthToYearDays(year, month);
    *jd = qDiv<4>(FourYears * yearDays.year) + yearDays.days + day + JulianBaseJd;
    return true;
}